

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bibOutline.cpp
# Opt level: O0

EntryData * getEntryData(EntryData *__return_storage_ptr__,TSNode entryNode,File *file)

{
  TSNode self;
  undefined1 auVar1 [24];
  TSNode node;
  TSNode self_00;
  TSNode self_01;
  TSNode node_00;
  TSNode self_02;
  int iVar2;
  uint32_t uVar3;
  char *__s1;
  Range RVar4;
  TSTree *in_stack_fffffffffffffe18;
  string local_198;
  uint32_t local_178 [2];
  uint32_t auStack_170 [2];
  uint32_t local_168 [2];
  void *pvStack_160;
  Range local_158;
  string local_148;
  uint32_t local_128 [2];
  uint32_t auStack_120 [2];
  uint32_t local_118 [2];
  void *pvStack_110;
  char *local_100;
  char *type;
  uint32_t auStack_f0 [2];
  void *local_e8;
  TSTree *pTStack_e0;
  undefined1 auStack_d8 [8];
  TSNode child;
  uint32_t i;
  uint32_t numChildren;
  File *file_local;
  EntryData *data;
  
  self_02 = entryNode;
  auVar1 = entryNode._8_24_;
  self.tree = in_stack_fffffffffffffe18;
  self.context[0] = auVar1._0_4_;
  self.context[1] = auVar1._4_4_;
  self.context[2] = auVar1._8_4_;
  self.context[3] = auVar1._12_4_;
  self.id = (void *)auVar1._16_8_;
  __s1 = ts_node_type(self);
  iVar2 = strcmp(__s1,"entry");
  if (iVar2 != 0) {
    __assert_fail("strcmp(ts_node_type(entryNode), \"entry\") == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/src/handlers/outline/bibOutline.cpp"
                  ,0x12,"EntryData getEntryData(TSNode, File &)");
  }
  node.tree = in_stack_fffffffffffffe18;
  node.context[0] = auVar1._0_4_;
  node.context[1] = auVar1._4_4_;
  node.context[2] = auVar1._8_4_;
  node.context[3] = auVar1._12_4_;
  node.id = (void *)auVar1._16_8_;
  RVar4 = nodeRange(node);
  EntryData::EntryData(__return_storage_ptr__,RVar4);
  self_00.tree = in_stack_fffffffffffffe18;
  self_00.context[0] = auVar1._0_4_;
  self_00.context[1] = auVar1._4_4_;
  self_00.context[2] = auVar1._8_4_;
  self_00.context[3] = auVar1._12_4_;
  self_00.id = (void *)auVar1._16_8_;
  uVar3 = ts_node_named_child_count(self_00);
  child.tree._0_4_ = 0;
  do {
    if (uVar3 <= (uint)child.tree) {
      return __return_storage_ptr__;
    }
    type = (char *)entryNode.context._0_8_;
    auStack_f0[0] = entryNode.context[2];
    auStack_f0[1] = entryNode.context[3];
    local_e8 = entryNode.id;
    pTStack_e0 = entryNode.tree;
    ts_node_named_child((TSNode *)auStack_d8,self_02,(uint)child.tree);
    local_118[0] = child.context[2];
    local_118[1] = child.context[3];
    pvStack_110 = child.id;
    local_128[0] = auStack_d8._0_4_;
    local_128[1] = auStack_d8._4_4_;
    auStack_120[0] = child.context[0];
    auStack_120[1] = child.context[1];
    self_01.context[2] = child.context[2];
    self_01.context[3] = child.context[3];
    self_01.context[0] = child.context[0];
    self_01.context[1] = child.context[1];
    self_01.id = child.id;
    self_01.tree = in_stack_fffffffffffffe18;
    local_100 = ts_node_type(self_01);
    iVar2 = strcmp(local_100,"name");
    if (iVar2 == 0) {
      File::utf8TextForNode_abi_cxx11_(&local_148,file,(TSNode *)auStack_d8);
      std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,(string *)&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      local_168[0] = child.context[2];
      local_168[1] = child.context[3];
      pvStack_160 = child.id;
      local_178[0] = auStack_d8._0_4_;
      local_178[1] = auStack_d8._4_4_;
      auStack_170[0] = child.context[0];
      auStack_170[1] = child.context[1];
      node_00.context[2] = child.context[2];
      node_00.context[3] = child.context[3];
      node_00.context[0] = child.context[0];
      node_00.context[1] = child.context[1];
      node_00.id = child.id;
      node_00.tree = in_stack_fffffffffffffe18;
      RVar4 = nodeRange(node_00);
      __return_storage_ptr__->selectionRange = RVar4;
      local_158 = RVar4;
      setEntryKind(__return_storage_ptr__);
    }
    else {
      iVar2 = strcmp(local_100,"key");
      if (iVar2 == 0) {
        File::utf8TextForNode_abi_cxx11_(&local_198,file,(TSNode *)auStack_d8);
        std::__cxx11::string::operator=((string *)&__return_storage_ptr__->key,(string *)&local_198)
        ;
        std::__cxx11::string::~string((string *)&local_198);
        return __return_storage_ptr__;
      }
    }
    child.tree._0_4_ = (uint)child.tree + 1;
  } while( true );
}

Assistant:

EntryData getEntryData (TSNode entryNode, File &file) {
    assert(strcmp(ts_node_type(entryNode), "entry") == 0);

    EntryData data { nodeRange(entryNode) };

    auto numChildren = ts_node_named_child_count(entryNode);
    for (uint32_t i = 0; i < numChildren; i++) {
        TSNode child = ts_node_named_child(entryNode, i);
        const char *type = ts_node_type(child);
        if (strcmp(type, "name") == 0) {
            data.name = file.utf8TextForNode(child);
            data.selectionRange = nodeRange(child);
            setEntryKind(data);
        } else if (strcmp(type, "key") == 0) {
            data.key = file.utf8TextForNode(child);
            return data;
        }
    }

    return data;
}